

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O3

char * __cxxabiv1::anon_unknown_0::parse_new_expr<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  pointer *ppsVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar3;
  byte bVar4;
  char cVar5;
  bool bVar6;
  size_type sVar7;
  char cVar8;
  char *pcVar9;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *this;
  pointer psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar11;
  char *pcVar12;
  bool bVar13;
  String r;
  String expr_list;
  String init_list;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  type;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_160;
  uint local_154;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_150;
  value_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_f0;
  undefined8 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_e0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_90;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_70;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_50;
  
  if ((long)last - (long)first < 4) {
    return first;
  }
  cVar8 = *first;
  bVar13 = false;
  pcVar12 = first;
  if (cVar8 == 'g') {
    bVar13 = first[1] == 's';
    cVar8 = first[(ulong)bVar13 * 2];
    pcVar12 = first + (ulong)bVar13 * 2;
  }
  if (cVar8 != 'n') {
    return first;
  }
  bVar4 = pcVar12[1];
  if ((bVar4 != 0x77) && (bVar4 != 0x61)) {
    return first;
  }
  pcVar12 = pcVar12 + 2;
  if (pcVar12 == last) {
    return first;
  }
  local_154 = (uint)bVar4;
  cVar8 = *pcVar12;
  cVar5 = cVar8;
  while (cVar5 != '_') {
    pcVar9 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(pcVar12,last,db);
    if (pcVar9 == pcVar12) {
      return first;
    }
    if (pcVar9 == last) {
      return first;
    }
    pcVar12 = pcVar9;
    cVar5 = *pcVar9;
  }
  pcVar9 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>(pcVar12 + 1,last,db);
  if (pcVar9 == last || pcVar9 == pcVar12 + 1) {
    return first;
  }
  bVar6 = 2 < (long)last - (long)pcVar9;
  cVar5 = *pcVar9;
  if (cVar5 == 'p' && bVar6) {
    if (pcVar9[1] != 'i') {
      return first;
    }
    pcVar9 = pcVar9 + 2;
    while (*pcVar9 != 'E') {
      pcVar12 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(pcVar9,last,db);
      if (pcVar12 == pcVar9) {
        return first;
      }
      pcVar9 = pcVar12;
      if (pcVar12 == last) {
        return first;
      }
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    psVar10 = (db->names).
              super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
               *)local_b0._M_dataplus._M_p;
    if ((db->names).
        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ._M_impl.super__Vector_impl_data._M_start == psVar10) goto LAB_0019fdad;
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_50,psVar10 + -1);
    (anonymous_namespace)::parse_new_expr<__cxxabiv1::(anonymous_namespace)::Db>();
  }
  else {
    if (cVar5 != 'E') {
      return first;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
  }
  psVar10 = (db->names).
            super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  paVar11 = &local_b0.field_2;
  if ((db->names).
      super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ._M_impl.super__Vector_impl_data._M_start == psVar10) goto LAB_0019fdad;
  this = psVar10 + -1;
  local_160 = &local_b0.field_2;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  ::move_full(&local_90,this);
  ppsVar1 = &(db->names).
             super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  psVar10 = *ppsVar1 + -1;
  *ppsVar1 = psVar10;
  std::
  allocator_traits<__cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>,4096ul>>
  ::
  destroy<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>>
            ((short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
              *)psVar10,this);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  if (cVar8 == '_') {
LAB_0019fa36:
    paVar11 = &local_150.field_2;
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    local_150._M_dataplus._M_p = (pointer)paVar11;
    if (bVar13) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::operator=(&local_150,"::");
    }
    pcVar12 = " ";
    if ((char)local_154 == 'a') {
      pcVar12 = "[] ";
    }
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::append(&local_150,pcVar12);
    if (cVar8 != '_') {
      std::operator+(&local_180,"(",&local_d0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::append(&local_180,") ");
      sVar7 = local_180._M_string_length;
      paVar2 = &local_130.first.field_2;
      paVar3 = &local_180.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_180._M_dataplus._M_p == paVar3) {
        local_130.first.field_2._8_8_ = local_180.field_2._8_8_;
        local_180._M_dataplus._M_p = (pointer)paVar2;
      }
      local_130.first._M_string_length = local_180._M_string_length;
      local_180._M_string_length = 0;
      local_180.field_2._M_local_buf[0] = '\0';
      local_130.first._M_dataplus._M_p = local_180._M_dataplus._M_p;
      local_180._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::_M_append(&local_150,local_130.first._M_dataplus._M_p,sVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_130.first._M_dataplus._M_p != paVar2) {
        free(local_130.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_180._M_dataplus._M_p != paVar3) {
        free(local_180._M_dataplus._M_p);
      }
    }
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::_M_append(&local_150,local_90._M_dataplus._M_p,local_90._M_string_length);
    if (cVar5 == 'p' && bVar6) {
      std::operator+(&local_180," (",&local_b0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::append(&local_180,")");
      sVar7 = local_180._M_string_length;
      paVar2 = &local_130.first.field_2;
      paVar3 = &local_180.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_180._M_dataplus._M_p == paVar3) {
        local_130.first.field_2._8_8_ = local_180.field_2._8_8_;
        local_180._M_dataplus._M_p = (pointer)paVar2;
      }
      local_130.first.field_2._M_allocated_capacity._1_7_ =
           local_180.field_2._M_allocated_capacity._1_7_;
      local_130.first.field_2._M_local_buf[0] = local_180.field_2._M_local_buf[0];
      local_130.first._M_string_length = local_180._M_string_length;
      local_180._M_string_length = 0;
      local_180.field_2._M_local_buf[0] = '\0';
      local_130.first._M_dataplus._M_p = local_180._M_dataplus._M_p;
      local_180._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::_M_append(&local_150,local_130.first._M_dataplus._M_p,sVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_130.first._M_dataplus._M_p != paVar2) {
        free(local_130.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_180._M_dataplus._M_p != paVar3) {
        free(local_180._M_dataplus._M_p);
      }
    }
    local_130.first._M_string_length = local_150._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_150._M_dataplus._M_p == paVar11) {
      local_e0._8_8_ = local_150.field_2._8_8_;
      local_150._M_dataplus._M_p = (pointer)&local_e0;
    }
    local_e0._M_allocated_capacity._1_7_ = local_150.field_2._M_allocated_capacity._1_7_;
    local_e0._M_local_buf[0] = local_150.field_2._M_local_buf[0];
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    local_130.first._M_dataplus._M_p = local_150._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_150._M_dataplus._M_p == &local_e0) {
      local_130.first.field_2._8_8_ = local_e0._8_8_;
      local_130.first._M_dataplus._M_p = (pointer)&local_130.first.field_2;
    }
    local_130.first.field_2._M_allocated_capacity = local_e0._M_allocated_capacity;
    local_130.second._M_dataplus._M_p = (pointer)&local_130.second.field_2;
    local_e8 = 0;
    local_e0._M_allocated_capacity =
         (ulong)(uint7)local_150.field_2._M_allocated_capacity._1_7_ << 8;
    local_130.second._M_string_length = 0;
    local_130.second.field_2._M_local_buf[0] = '\0';
    local_150._M_dataplus._M_p = (pointer)paVar11;
    local_f0 = &local_e0;
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::push_back(&db->names,&local_130);
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::~string_pair(&local_130);
    if (local_f0 != &local_e0) {
      free(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      free(local_150._M_dataplus._M_p);
    }
    first = pcVar9 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      free(local_d0._M_dataplus._M_p);
    }
  }
  else {
    psVar10 = (db->names).
              super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((db->names).
        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ._M_impl.super__Vector_impl_data._M_start != psVar10) {
      string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
      ::move_full(&local_70,psVar10 + -1);
      (anonymous_namespace)::parse_new_expr<__cxxabiv1::(anonymous_namespace)::Db>();
      goto LAB_0019fa36;
    }
  }
  paVar11 = local_160;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    free(local_90._M_dataplus._M_p);
    paVar11 = local_160;
  }
LAB_0019fdad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar11) {
    free(local_b0._M_dataplus._M_p);
  }
  return first;
}

Assistant:

const char*
parse_new_expr(const char* first, const char* last, C& db)
{
    if (last - first >= 4)
    {
        const char* t = first;
        bool parsed_gs = false;
        if (t[0] == 'g' && t[1] == 's')
        {
            t += 2;
            parsed_gs = true;
        }
        if (t[0] == 'n' && (t[1] == 'w' || t[1] == 'a'))
        {
            bool is_array = t[1] == 'a';
            t += 2;
            if (t == last)
                return first;
            bool has_expr_list = false;
            bool first_expr = true;
            while (*t != '_')
            {
                const char* t1 = parse_expression(t, last, db);
                if (t1 == t || t1 == last)
                    return first;
                has_expr_list = true;
                if (!first_expr)
                {
                    if (db.names.empty())
                        return first;
                    auto tmp = db.names.back().move_full();
                    db.names.pop_back();
                    if (!tmp.empty())
                    {
                        if (db.names.empty())
                            return first;
                        db.names.back().first.append(", ");
                        db.names.back().first.append(tmp);
                        first_expr = false;
                    }
                }
                t = t1;
            }
            ++t;
            const char* t1 = parse_type(t, last, db);
            if (t1 == t || t1 == last)
                return first;
            t = t1;
            bool has_init = false;
            if (last - t >= 3 && t[0] == 'p' && t[1] == 'i')
            {
                t += 2;
                has_init = true;
                first_expr = true;
                while (*t != 'E')
                {
                    t1 = parse_expression(t, last, db);
                    if (t1 == t || t1 == last)
                        return first;
                    if (!first_expr)
                    {
                        if (db.names.empty())
                            return first;
                        auto tmp = db.names.back().move_full();
                        db.names.pop_back();
                        if (!tmp.empty())
                        {
                            if (db.names.empty())
                                return first;
                            db.names.back().first.append(", ");
                            db.names.back().first.append(tmp);
                            first_expr = false;
                        }
                    }
                    t = t1;
                }
            }
            if (*t != 'E')
                return first;
            typename C::String init_list;
            if (has_init)
            {
                if (db.names.empty())
                    return first;
                init_list = db.names.back().move_full();
                db.names.pop_back();
            }
            if (db.names.empty())
                return first;
            auto type = db.names.back().move_full();
            db.names.pop_back();
            typename C::String expr_list;
            if (has_expr_list)
            {
                if (db.names.empty())
                    return first;
                expr_list = db.names.back().move_full();
                db.names.pop_back();
            }
            typename C::String r;
            if (parsed_gs)
                r = "::";
            if (is_array)
                r += "[] ";
            else
                r += " ";
            if (has_expr_list)
                r += "(" + expr_list + ") ";
            r += type;
            if (has_init)
                r += " (" + init_list + ")";
            db.names.push_back(std::move(r));
            first = t+1;
        }
    }
    return first;
}